

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

void __thiscall
cnn::Tensor::save<boost::archive::text_oarchive>(Tensor *this,text_oarchive *ar,uint param_2)

{
  float *pfVar1;
  uint uVar2;
  array_wrapper<float> a;
  array_wrapper<float> local_28;
  
  boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::save_standard::
  invoke<cnn::Dim>(ar,&this->d);
  pfVar1 = this->v;
  uVar2 = Dim::size(&this->d);
  local_28.m_element_count = (size_t)uVar2;
  local_28.m_t = pfVar1;
  boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::save_only::
  invoke<boost::serialization::array_wrapper<float>>(ar,&local_28);
  return;
}

Assistant:

void save(Archive& ar, const unsigned int) const {
    ar & d;
#if HAVE_CUDA
    float* vc = (float*)malloc(d.size() * sizeof(float));
    CUDA_CHECK(cudaMemcpy(vc, v, d.size() * sizeof(float), cudaMemcpyDeviceToHost));
    ar & boost::serialization::make_array(vc, d.size());
    free(vc);
#else
    ar & boost::serialization::make_array(v, d.size());
#endif
  }